

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O3

void special(void)

{
  r[0].type = 'N';
  l[0].type = 'N';
  cmp_1(2,l,r,1,1,(rtosc_cmp_options *)0x0,"nil","nil",0x5c);
  r[0].type = 'F';
  l[0].type = 'F';
  r[0].val.T = '\0';
  l[0].val.T = '\0';
  cmp_1(2,l,r,1,1,(rtosc_cmp_options *)0x0,"false","false",0x5e);
  r[0].type = 'T';
  l[0].type = 'T';
  r[0].val.T = '\x01';
  l[0].val.T = '\x01';
  cmp_1(2,l,r,1,1,(rtosc_cmp_options *)0x0,"true","true",0x60);
  r[0].type = 'I';
  l[0].type = 'I';
  cmp_1(2,l,r,1,1,(rtosc_cmp_options *)0x0,"inf","inf",0x62);
  return;
}

Assistant:

void special()
{
    asn_special(l, r, 'N');
    cmp_1(eq, l, r, 1, 1, NULL, "nil", "nil", __LINE__);
    asn_special(l, r, 'F');
    cmp_1(eq, l, r, 1, 1, NULL, "false", "false", __LINE__);
    asn_special(l, r, 'T');
    cmp_1(eq, l, r, 1, 1, NULL, "true", "true", __LINE__);
    asn_special(l, r, 'I');
    cmp_1(eq, l, r, 1, 1, NULL, "inf", "inf", __LINE__);
}